

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format-inl.h
# Opt level: O2

void __thiscall
fmt::v8::detail::format_error_code
          (detail *this,buffer<char> *out,int error_code,string_view message)

{
  uint uVar1;
  uint uVar2;
  type tVar3;
  undefined4 in_register_00000014;
  ulong uVar4;
  string_view fmt;
  string_view fmt_00;
  format_args args;
  format_args args_00;
  char *local_48;
  char *local_40;
  char *local_38;
  
  buffer<char>::try_resize((buffer<char> *)this,0);
  uVar4 = (ulong)(uint)-(int)out;
  if (0 < (int)out) {
    uVar4 = (ulong)out & 0xffffffff;
  }
  uVar2 = (uint)uVar4 | 1;
  uVar1 = 0x1f;
  if (uVar2 != 0) {
    for (; uVar2 >> uVar1 == 0; uVar1 = uVar1 - 1) {
    }
  }
  tVar3 = to_unsigned<int>((int)(uVar4 + *(long *)(do_count_digits(unsigned_int)::table +
                                                  (ulong)uVar1 * 8) >> 0x20));
  if (message.data_ <= (char *)(0x1ec - ((((ulong)out & 0xffffffff) >> 0x1f) + (ulong)tVar3))) {
    local_38 = ": ";
    fmt.size_ = 4;
    fmt.data_ = "{}{}";
    args.field_1.values_ =
         (value<fmt::v8::basic_format_context<fmt::v8::appender,_char>_> *)&local_48;
    args.desc_ = 0xcd;
    local_48 = (char *)CONCAT44(in_register_00000014,error_code);
    local_40 = message.data_;
    vformat_to<fmt::v8::appender,_0>((appender)this,fmt,args);
  }
  local_38 = (char *)((ulong)out & 0xffffffff);
  local_48 = "error ";
  fmt_00.size_ = 4;
  fmt_00.data_ = "{}{}";
  args_00.field_1.values_ =
       (value<fmt::v8::basic_format_context<fmt::v8::appender,_char>_> *)&local_48;
  args_00.desc_ = 0x1c;
  vformat_to<fmt::v8::appender,_0>((appender)this,fmt_00,args_00);
  if (*(ulong *)(this + 0x10) < 0x1f5) {
    return;
  }
  assert_fail("/workspace/llm4binary/github/license_c_cmakelists/tosinalagbe[P]hedg/include/fmt/format-inl.h"
              ,0x4c,"");
}

Assistant:

FMT_FUNC void format_error_code(detail::buffer<char>& out, int error_code,
                                string_view message) FMT_NOEXCEPT {
  // Report error code making sure that the output fits into
  // inline_buffer_size to avoid dynamic memory allocation and potential
  // bad_alloc.
  out.try_resize(0);
  static const char SEP[] = ": ";
  static const char ERROR_STR[] = "error ";
  // Subtract 2 to account for terminating null characters in SEP and ERROR_STR.
  size_t error_code_size = sizeof(SEP) + sizeof(ERROR_STR) - 2;
  auto abs_value = static_cast<uint32_or_64_or_128_t<int>>(error_code);
  if (detail::is_negative(error_code)) {
    abs_value = 0 - abs_value;
    ++error_code_size;
  }
  error_code_size += detail::to_unsigned(detail::count_digits(abs_value));
  auto it = buffer_appender<char>(out);
  if (message.size() <= inline_buffer_size - error_code_size)
    format_to(it, FMT_STRING("{}{}"), message, SEP);
  format_to(it, FMT_STRING("{}{}"), ERROR_STR, error_code);
  FMT_ASSERT(out.size() <= inline_buffer_size, "");
}